

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3Fts5ConfigParseRank(char *zIn,char **pzRank,char **pzRankArgs)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char *__dest;
  char *__dest_00;
  int iVar4;
  int rc;
  char **local_38;
  
  rc = 0;
  *pzRank = (char *)0x0;
  *pzRankArgs = (char *)0x0;
  iVar1 = 1;
  if (zIn != (char *)0x0) {
    pcVar2 = fts5ConfigSkipWhitespace(zIn);
    pcVar3 = fts5ConfigSkipBareword(pcVar2);
    if (pcVar3 != (char *)0x0) {
      local_38 = pzRank;
      __dest = (char *)sqlite3Fts5MallocZero(&rc,((long)pcVar3 - (long)pcVar2) + 1);
      if (__dest != (char *)0x0) {
        memcpy(__dest,pcVar2,(long)pcVar3 - (long)pcVar2);
      }
      iVar4 = rc;
      if ((rc == 0) && (pcVar2 = fts5ConfigSkipWhitespace(pcVar3), iVar4 = iVar1, *pcVar2 == '(')) {
        pcVar3 = fts5ConfigSkipWhitespace(pcVar2 + 1);
        pcVar2 = pcVar3;
        if (*pcVar3 == ')') {
LAB_001b4da2:
          __dest_00 = (char *)0x0;
LAB_001b4da5:
          iVar4 = rc;
          if (rc == 0) {
            *local_38 = __dest;
            *pzRankArgs = __dest_00;
            return 0;
          }
        }
        else {
          while( true ) {
            pcVar2 = fts5ConfigSkipWhitespace(pcVar2);
            pcVar2 = fts5ConfigSkipLiteral(pcVar2);
            pcVar2 = fts5ConfigSkipWhitespace(pcVar2);
            if (pcVar2 == (char *)0x0) break;
            if (*pcVar2 != ',') {
              if (*pcVar2 == ')') {
                __dest_00 = (char *)sqlite3Fts5MallocZero(&rc,((long)pcVar2 - (long)pcVar3) + 1);
                if (__dest_00 == (char *)0x0) goto LAB_001b4da2;
                memcpy(__dest_00,pcVar3,(long)pcVar2 - (long)pcVar3);
                goto LAB_001b4da5;
              }
              break;
            }
            pcVar2 = pcVar2 + 1;
          }
        }
      }
      goto LAB_001b4d6c;
    }
  }
  __dest = (char *)0x0;
  iVar4 = iVar1;
LAB_001b4d6c:
  sqlite3_free(__dest);
  return iVar4;
}

Assistant:

static int sqlite3Fts5ConfigParseRank(
  const char *zIn,                /* Input string */
  char **pzRank,                  /* OUT: Rank function name */
  char **pzRankArgs               /* OUT: Rank function arguments */
){
  const char *p = zIn;
  const char *pRank;
  char *zRank = 0;
  char *zRankArgs = 0;
  int rc = SQLITE_OK;

  *pzRank = 0;
  *pzRankArgs = 0;

  if( p==0 ){
    rc = SQLITE_ERROR;
  }else{
    p = fts5ConfigSkipWhitespace(p);
    pRank = p;
    p = fts5ConfigSkipBareword(p);

    if( p ){
      zRank = sqlite3Fts5MallocZero(&rc, 1 + p - pRank);
      if( zRank ) memcpy(zRank, pRank, p-pRank);
    }else{
      rc = SQLITE_ERROR;
    }

    if( rc==SQLITE_OK ){
      p = fts5ConfigSkipWhitespace(p);
      if( *p!='(' ) rc = SQLITE_ERROR;
      p++;
    }
    if( rc==SQLITE_OK ){
      const char *pArgs; 
      p = fts5ConfigSkipWhitespace(p);
      pArgs = p;
      if( *p!=')' ){
        p = fts5ConfigSkipArgs(p);
        if( p==0 ){
          rc = SQLITE_ERROR;
        }else{
          zRankArgs = sqlite3Fts5MallocZero(&rc, 1 + p - pArgs);
          if( zRankArgs ) memcpy(zRankArgs, pArgs, p-pArgs);
        }
      }
    }
  }

  if( rc!=SQLITE_OK ){
    sqlite3_free(zRank);
    assert( zRankArgs==0 );
  }else{
    *pzRank = zRank;
    *pzRankArgs = zRankArgs;
  }
  return rc;
}